

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::CNullDriver
          (CNullDriver *this,IFileSystem *io,dimension2d<unsigned_int> *screenSize)

{
  array<irr::video::IImageLoader_*> *this_00;
  undefined1 *puVar1;
  ushort *puVar2;
  IFileSystem *pIVar3;
  uint uVar4;
  uint uVar5;
  u8 uVar6;
  undefined2 uVar7;
  f32 fVar8;
  f32 fVar9;
  f32 fVar10;
  SColor SVar11;
  f32 fVar12;
  f32 fVar13;
  f32 fVar14;
  E_MATERIAL_TYPE EVar15;
  SColor SVar16;
  SColor SVar17;
  SColor SVar18;
  vector<irr::video::IImageWriter*,std::allocator<irr::video::IImageWriter*>> *this_01;
  CAttributes *this_02;
  IMeshManipulator *pIVar19;
  long lVar20;
  SMaterialLayer *this_03;
  IImageLoader *local_50;
  dimension2d<unsigned_int> *local_48;
  SExposedVideoData *local_40;
  vector<irr::video::IImageWriter*,std::allocator<irr::video::IImageWriter*>> *local_38;
  
  *(undefined8 *)&this->field_0x498 = 0;
  *(undefined4 *)&this->field_0x4a0 = 1;
  (this->super_IVideoDriver)._vptr_IVideoDriver = (_func_int **)0x265c08;
  *(undefined8 *)&this->field_0x490 = 0x266018;
  *(undefined8 *)&(this->super_IVideoDriver).field_0x8 = 0x265fd0;
  *(undefined8 *)&(this->super_IVideoDriver).field_0x10 = 0;
  *(undefined8 *)&(this->super_IVideoDriver).field_0x18 = 0;
  *(undefined8 *)&this->field_0x20 = 0;
  this->field_0x28 = 1;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OcclusionQueries).m_data.
  super__Vector_base<irr::video::CNullDriver::SOccQuery,_std::allocator<irr::video::CNullDriver::SOccQuery>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OcclusionQueries).is_sorted = true;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->RenderTargets).m_data.
  super__Vector_base<irr::video::IRenderTarget_*,_std::allocator<irr::video::IRenderTarget_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->RenderTargets).is_sorted = true;
  this->SharedRenderTarget = (IRenderTarget *)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SharedDepthTextures).m_data.
  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SharedDepthTextures).is_sorted = true;
  this_00 = &this->SurfaceLoader;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SurfaceLoader).m_data.
  super__Vector_base<irr::video::IImageLoader_*,_std::allocator<irr::video::IImageLoader_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->CurrentRenderTarget = (IRenderTarget *)0x0;
  (this->CurrentRenderTargetSize).Width = 0;
  (this->CurrentRenderTargetSize).Height = 0;
  (this->SurfaceLoader).is_sorted = true;
  local_38 = (vector<irr::video::IImageWriter*,std::allocator<irr::video::IImageWriter*>> *)
             &this->SurfaceWriter;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->SurfaceWriter).m_data.
  super__Vector_base<irr::video::IImageWriter_*,_std::allocator<irr::video::IImageWriter_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->SurfaceWriter).is_sorted = true;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->MaterialRenderers).m_data.
  super__Vector_base<irr::video::CNullDriver::SMaterialRenderer,_std::allocator<irr::video::CNullDriver::SMaterialRenderer>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->MaterialRenderers).is_sorted = true;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->HWBufferList;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->HWBufferList;
  (this->HWBufferList).
  super__List_base<irr::video::CNullDriver::SHWBufferLink_*,_std::allocator<irr::video::CNullDriver::SHWBufferLink_*>_>
  ._M_impl._M_node._M_size = 0;
  this->FileSystem = io;
  this->MeshManipulator = (IMeshManipulator *)0x0;
  (this->ViewPort).UpperLeftCorner.X = 0;
  (this->ViewPort).UpperLeftCorner.Y = 0;
  (this->ViewPort).LowerRightCorner.X = 0;
  (this->ViewPort).LowerRightCorner.Y = 0;
  this->ScreenSize = *screenSize;
  (this->TransformationMatrix).M[0xc] = 0.0;
  (this->TransformationMatrix).M[0xd] = 0.0;
  (this->TransformationMatrix).M[0xe] = 0.0;
  (this->TransformationMatrix).M[0xf] = 0.0;
  (this->TransformationMatrix).M[8] = 0.0;
  (this->TransformationMatrix).M[9] = 0.0;
  (this->TransformationMatrix).M[10] = 0.0;
  (this->TransformationMatrix).M[0xb] = 0.0;
  (this->TransformationMatrix).M[4] = 0.0;
  (this->TransformationMatrix).M[5] = 0.0;
  (this->TransformationMatrix).M[6] = 0.0;
  (this->TransformationMatrix).M[7] = 0.0;
  (this->TransformationMatrix).M[0] = 0.0;
  (this->TransformationMatrix).M[1] = 0.0;
  (this->TransformationMatrix).M[2] = 0.0;
  (this->TransformationMatrix).M[3] = 0.0;
  (this->TransformationMatrix).M[0xf] = 1.0;
  (this->TransformationMatrix).M[10] = 1.0;
  (this->TransformationMatrix).M[5] = 1.0;
  (this->TransformationMatrix).M[0] = 1.0;
  local_48 = screenSize;
  CFPSCounter::CFPSCounter(&this->FPSCounter);
  this->PrimitivesDrawn = 0;
  this->MinVertexCountForVBO = 500;
  this->TextureCreationFlags = 0;
  local_40 = &this->ExposedData;
  (this->ExposedData).field_0.OpenGLWin32.HDc = (void *)0x0;
  (this->ExposedData).field_0.OpenGLWin32.HRc = (void *)0x0;
  (this->ExposedData).field_0.OpenGLWin32.HWnd = (void *)0x0;
  SMaterial::SMaterial(&(this->OverrideMaterial).Material);
  (this->OverrideMaterial).EnableProps = 0;
  (this->OverrideMaterial).EnablePasses = 0;
  (this->OverrideMaterial).Enabled = false;
  (this->OverrideMaterial).MaterialTypes.m_data.
  super__Vector_base<irr::video::SOverrideMaterial::SMaterialTypeReplacement,_std::allocator<irr::video::SOverrideMaterial::SMaterialTypeReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->OverrideMaterial).MaterialTypes.m_data.
  super__Vector_base<irr::video::SOverrideMaterial::SMaterialTypeReplacement,_std::allocator<irr::video::SOverrideMaterial::SMaterialTypeReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->OverrideMaterial).MaterialTypes.m_data.
  super__Vector_base<irr::video::SOverrideMaterial::SMaterialTypeReplacement,_std::allocator<irr::video::SOverrideMaterial::SMaterialTypeReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->OverrideMaterial).MaterialTypes.is_sorted = true;
  SMaterial::SMaterial(&this->OverrideMaterial2D);
  this_03 = (this->InitMaterial2D).TextureLayers;
  SMaterial::SMaterial((SMaterial *)this_03);
  this->OverrideMaterial2DEnabled = false;
  this->AllowZWriteOnTransparent = false;
  (this->AmbientLight).r = 0.0;
  (this->AmbientLight).g = 0.0;
  (this->AmbientLight).b = 0.0;
  (this->AmbientLight).a = 1.0;
  this_02 = (CAttributes *)operator_new(0x48);
  irr::io::CAttributes::CAttributes(this_02,(IVideoDriver *)0x0);
  this->DriverAttributes = (IAttributes *)this_02;
  (*(this_02->super_IAttributes)._vptr_IAttributes[7])(this_02,"MaxTextures",4);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxSupportedTextures",4);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxAnisotropy",1);
  (*this->DriverAttributes->_vptr_IAttributes[7])
            (this->DriverAttributes,"MaxMultipleRenderTargets",1);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"MaxIndices",0xffffffff);
  (*this->DriverAttributes->_vptr_IAttributes[7])
            (this->DriverAttributes,"MaxTextureSize",0xffffffff);
  (*this->DriverAttributes->_vptr_IAttributes[7])(this->DriverAttributes,"Version",1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x38])
            (0x42480000,0x42c80000,0x3c23d70a,this,0xffffff,1,0,0);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,2,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x10,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x100,1);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x43])(this,0x80,1);
  uVar4 = local_48->Width;
  uVar5 = local_48->Height;
  (this->ViewPort).UpperLeftCorner.X = 0;
  (this->ViewPort).UpperLeftCorner.Y = 0;
  (this->ViewPort).LowerRightCorner.X = uVar4;
  (this->ViewPort).LowerRightCorner.Y = uVar5;
  pIVar19 = (IMeshManipulator *)operator_new(0x20);
  pIVar19->_vptr_IMeshManipulator = (_func_int **)0x0;
  *(undefined8 *)&pIVar19->field_0x8 = 0;
  *(undefined8 *)&pIVar19->field_0x10 = 0;
  *(undefined8 *)&pIVar19->field_0x18 = 0;
  *(undefined ***)&pIVar19->field_0x8 = &PTR__IReferenceCounted_00261738;
  *(undefined8 *)&pIVar19->field_0x10 = 0;
  *(undefined4 *)&pIVar19->field_0x18 = 1;
  pIVar19->_vptr_IMeshManipulator = (_func_int **)&PTR___cxa_pure_virtual_00264ce8;
  *(undefined ***)&pIVar19->field_0x8 = &PTR__IMeshManipulator_00264d40;
  pIVar19->_vptr_IMeshManipulator = (_func_int **)0x264c48;
  *(undefined8 *)&pIVar19->field_0x8 = 0x264ca0;
  this->MeshManipulator = pIVar19;
  pIVar3 = this->FileSystem;
  if (pIVar3 != (IFileSystem *)0x0) {
    *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IFileSystem[-3]) =
         *(int *)(&pIVar3->field_0x10 + (long)pIVar3->_vptr_IFileSystem[-3]) + 1;
  }
  local_50 = createImageLoaderTGA();
  ::std::vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>>::
  emplace_back<irr::video::IImageLoader*>
            ((vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>> *)this_00,
             &local_50);
  lVar20 = 0;
  (this->SurfaceLoader).is_sorted = false;
  local_50 = createImageLoaderPNG();
  ::std::vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>>::
  emplace_back<irr::video::IImageLoader*>
            ((vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>> *)this_00,
             &local_50);
  (this->SurfaceLoader).is_sorted = false;
  local_50 = createImageLoaderJPG();
  ::std::vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>>::
  emplace_back<irr::video::IImageLoader*>
            ((vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>> *)this_00,
             &local_50);
  (this->SurfaceLoader).is_sorted = false;
  local_50 = createImageLoaderBMP();
  ::std::vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>>::
  emplace_back<irr::video::IImageLoader*>
            ((vector<irr::video::IImageLoader*,std::allocator<irr::video::IImageLoader*>> *)this_00,
             &local_50);
  (this->SurfaceLoader).is_sorted = false;
  local_50 = (IImageLoader *)createImageWriterJPG();
  this_01 = local_38;
  ::std::vector<irr::video::IImageWriter*,std::allocator<irr::video::IImageWriter*>>::
  emplace_back<irr::video::IImageWriter*>(local_38,(IImageWriter **)&local_50);
  (this->SurfaceWriter).is_sorted = false;
  local_50 = (IImageLoader *)createImageWriterPNG();
  ::std::vector<irr::video::IImageWriter*,std::allocator<irr::video::IImageWriter*>>::
  emplace_back<irr::video::IImageWriter*>(this_01,(IImageWriter **)&local_50);
  (this->SurfaceWriter).is_sorted = false;
  (local_40->field_0).OpenGLWin32.HWnd = (void *)0x0;
  (local_40->field_0).OpenGLLinux.GLXWindow = 0;
  (local_40->field_0).OpenGLWin32.HDc = (void *)0x0;
  (local_40->field_0).OpenGLWin32.HRc = (void *)0x0;
  this->FeatureEnabled[0x1f] = true;
  this->FeatureEnabled[0x20] = true;
  this->FeatureEnabled[0x21] = true;
  this->FeatureEnabled[0x22] = true;
  this->FeatureEnabled[0x23] = true;
  this->FeatureEnabled[0x24] = true;
  this->FeatureEnabled[0x25] = true;
  this->FeatureEnabled[0x26] = true;
  this->FeatureEnabled[0x10] = true;
  this->FeatureEnabled[0x11] = true;
  this->FeatureEnabled[0x12] = true;
  this->FeatureEnabled[0x13] = true;
  this->FeatureEnabled[0x14] = true;
  this->FeatureEnabled[0x15] = true;
  this->FeatureEnabled[0x16] = true;
  this->FeatureEnabled[0x17] = true;
  this->FeatureEnabled[0x18] = true;
  this->FeatureEnabled[0x19] = true;
  this->FeatureEnabled[0x1a] = true;
  this->FeatureEnabled[0x1b] = true;
  this->FeatureEnabled[0x1c] = true;
  this->FeatureEnabled[0x1d] = true;
  this->FeatureEnabled[0x1e] = true;
  this->FeatureEnabled[0x1f] = true;
  this->FeatureEnabled[0] = true;
  this->FeatureEnabled[1] = true;
  this->FeatureEnabled[2] = true;
  this->FeatureEnabled[3] = true;
  this->FeatureEnabled[4] = true;
  this->FeatureEnabled[5] = true;
  this->FeatureEnabled[6] = true;
  this->FeatureEnabled[7] = true;
  this->FeatureEnabled[8] = true;
  this->FeatureEnabled[9] = true;
  this->FeatureEnabled[10] = true;
  this->FeatureEnabled[0xb] = true;
  this->FeatureEnabled[0xc] = true;
  this->FeatureEnabled[0xd] = true;
  this->FeatureEnabled[0xe] = true;
  this->FeatureEnabled[0xf] = true;
  (this->InitMaterial2D).ZBuffer = '\0';
  (this->InitMaterial2D).AntiAliasing = '\0';
  puVar1 = &(this->InitMaterial2D).field_0xb0;
  *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfbc7;
  do {
    *(undefined8 *)((long)&(this->InitMaterial2D).TextureLayers[0].MinFilter + lVar20) = 1;
    puVar2 = (ushort *)(&(this->InitMaterial2D).TextureLayers[0].field_0x8 + lVar20);
    *puVar2 = *puVar2 & 0xf000;
    lVar20 = lVar20 + 0x20;
  } while (lVar20 != 0x80);
  lVar20 = 4;
  do {
    SMaterialLayer::operator=((SMaterialLayer *)&this_03[-6].field_0x8,this_03);
    this_03 = this_03 + 1;
    lVar20 = lVar20 + -1;
  } while (lVar20 != 0);
  *(undefined2 *)&(this->OverrideMaterial2D).field_0xb0 =
       *(undefined2 *)&(this->InitMaterial2D).field_0xb0;
  EVar15 = (this->InitMaterial2D).MaterialType;
  SVar16.color = (this->InitMaterial2D).AmbientColor.color;
  SVar17.color = (this->InitMaterial2D).DiffuseColor.color;
  SVar18.color = (this->InitMaterial2D).EmissiveColor.color;
  SVar11.color = (this->InitMaterial2D).SpecularColor.color;
  fVar12 = (this->InitMaterial2D).Shininess;
  fVar13 = (this->InitMaterial2D).MaterialTypeParam;
  fVar14 = (this->InitMaterial2D).Thickness;
  uVar6 = (this->InitMaterial2D).AntiAliasing;
  uVar7 = *(undefined2 *)&(this->InitMaterial2D).field_0xa2;
  fVar8 = (this->InitMaterial2D).BlendFactor;
  fVar9 = (this->InitMaterial2D).PolygonOffsetDepthBias;
  fVar10 = (this->InitMaterial2D).PolygonOffsetSlopeScale;
  (this->OverrideMaterial2D).ZBuffer = (this->InitMaterial2D).ZBuffer;
  (this->OverrideMaterial2D).AntiAliasing = uVar6;
  *(undefined2 *)&(this->OverrideMaterial2D).field_0xa2 = uVar7;
  (this->OverrideMaterial2D).BlendFactor = fVar8;
  (this->OverrideMaterial2D).PolygonOffsetDepthBias = fVar9;
  (this->OverrideMaterial2D).PolygonOffsetSlopeScale = fVar10;
  (this->OverrideMaterial2D).SpecularColor = (SColor)SVar11.color;
  (this->OverrideMaterial2D).Shininess = fVar12;
  (this->OverrideMaterial2D).MaterialTypeParam = fVar13;
  (this->OverrideMaterial2D).Thickness = fVar14;
  (this->OverrideMaterial2D).MaterialType = EVar15;
  (this->OverrideMaterial2D).AmbientColor = (SColor)SVar16.color;
  (this->OverrideMaterial2D).DiffuseColor = (SColor)SVar17.color;
  (this->OverrideMaterial2D).EmissiveColor = (SColor)SVar18.color;
  return;
}

Assistant:

CNullDriver::CNullDriver(io::IFileSystem *io, const core::dimension2d<u32> &screenSize) :
		SharedRenderTarget(0), CurrentRenderTarget(0), CurrentRenderTargetSize(0, 0), FileSystem(io), MeshManipulator(0),
		ViewPort(0, 0, 0, 0), ScreenSize(screenSize), PrimitivesDrawn(0), MinVertexCountForVBO(500),
		TextureCreationFlags(0), OverrideMaterial2DEnabled(false), AllowZWriteOnTransparent(false)
{
#ifdef _DEBUG
	setDebugName("CNullDriver");
#endif

	DriverAttributes = new io::CAttributes();
	DriverAttributes->addInt("MaxTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxSupportedTextures", MATERIAL_MAX_TEXTURES);
	DriverAttributes->addInt("MaxAnisotropy", 1);
	//	DriverAttributes->addInt("MaxUserClipPlanes", 0);
	//	DriverAttributes->addInt("MaxAuxBuffers", 0);
	DriverAttributes->addInt("MaxMultipleRenderTargets", 1);
	DriverAttributes->addInt("MaxIndices", -1);
	DriverAttributes->addInt("MaxTextureSize", -1);
	//	DriverAttributes->addInt("MaxGeometryVerticesOut", 0);
	//	DriverAttributes->addFloat("MaxTextureLODBias", 0.f);
	DriverAttributes->addInt("Version", 1);
	//	DriverAttributes->addInt("ShaderLanguageVersion", 0);
	//	DriverAttributes->addInt("AntiAlias", 0);

	setFog();

	setTextureCreationFlag(ETCF_ALWAYS_32_BIT, true);
	setTextureCreationFlag(ETCF_CREATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_AUTO_GENERATE_MIP_MAPS, true);
	setTextureCreationFlag(ETCF_ALLOW_MEMORY_COPY, true);

	ViewPort = core::rect<s32>(core::position2d<s32>(0, 0), core::dimension2di(screenSize));

	// create manipulator
	MeshManipulator = new scene::CMeshManipulator();

	if (FileSystem)
		FileSystem->grab();

	// create surface loaders and writers
	SurfaceLoader.push_back(video::createImageLoaderTGA());
	SurfaceLoader.push_back(video::createImageLoaderPNG());
	SurfaceLoader.push_back(video::createImageLoaderJPG());
	SurfaceLoader.push_back(video::createImageLoaderBMP());

	SurfaceWriter.push_back(video::createImageWriterJPG());
	SurfaceWriter.push_back(video::createImageWriterPNG());

	// set ExposedData to 0
	memset((void *)&ExposedData, 0, sizeof(ExposedData));
	for (u32 i = 0; i < video::EVDF_COUNT; ++i)
		FeatureEnabled[i] = true;

	InitMaterial2D.AntiAliasing = video::EAAM_OFF;
	InitMaterial2D.Lighting = false;
	InitMaterial2D.ZWriteEnable = video::EZW_OFF;
	InitMaterial2D.ZBuffer = video::ECFN_DISABLED;
	InitMaterial2D.UseMipMaps = false;
	InitMaterial2D.forEachTexture([](auto &tex) {
		// Using ETMINF_LINEAR_MIPMAP_NEAREST (bilinear) for 2D graphics looks
		// much better and doesn't have any downsides (e.g. regarding pixel art).
		tex.MinFilter = video::ETMINF_LINEAR_MIPMAP_NEAREST;
		tex.MagFilter = video::ETMAGF_NEAREST;
		tex.TextureWrapU = video::ETC_REPEAT;
		tex.TextureWrapV = video::ETC_REPEAT;
		tex.TextureWrapW = video::ETC_REPEAT;
	});
	OverrideMaterial2D = InitMaterial2D;
}